

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>>
::redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>>
           *this,scalar_sum_op<float,_float> *func)

{
  bool bVar1;
  evaluator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_> func_00;
  Index IVar2;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
  *pCVar3;
  Scalar SVar4;
  undefined1 local_28 [8];
  ThisEvaluator thisEval;
  scalar_sum_op<float,_float> *func_local;
  DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *this_local;
  
  thisEval.
  super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  .
  super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_float>
  .m_d.argImpl.super_evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>.m_d.data =
       (evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)
       (evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>)func;
  IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ::rows((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  *)this);
  bVar1 = false;
  if (0 < IVar2) {
    IVar2 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ::cols((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    *)this);
    bVar1 = false;
    if (0 < IVar2) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                  ,0x19b,
                  "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>, const Eigen::Matrix<float, 3, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>, const Eigen::Matrix<float, 3, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
                 );
  }
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)this);
  internal::
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::redux_evaluator((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                     *)local_28,pCVar3);
  func_00 = thisEval.
            super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            .
            super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::internal::IndexBased,_float>
            .m_d.argImpl;
  pCVar3 = EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ::derived((EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)this);
  SVar4 = internal::
          redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>>,3,2>
          ::
          run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>>
                    ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)local_28,
                     (scalar_sum_op<float,_float> *)
                     func_00.super_evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>.
                     m_d.data,pCVar3);
  internal::
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ::~redux_evaluator((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)local_28);
  return SVar4;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}